

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt_utils.h
# Opt level: O0

void get_qc_dqc_low(tran_low_t abs_qc,int sign,int dqv,int shift,tran_low_t *qc_low,
                   tran_low_t *dqc_low)

{
  tran_low_t abs_dqc_low;
  tran_low_t abs_qc_low;
  tran_low_t *dqc_low_local;
  tran_low_t *qc_low_local;
  int shift_local;
  int dqv_local;
  int sign_local;
  tran_low_t abs_qc_local;
  
  *qc_low = (-sign ^ abs_qc - 1U) + sign;
  *dqc_low = (-sign ^ (int)((abs_qc - 1U) * dqv) >> ((byte)shift & 0x1f)) + sign;
  return;
}

Assistant:

static inline void get_qc_dqc_low(tran_low_t abs_qc, int sign, int dqv,
                                  int shift, tran_low_t *qc_low,
                                  tran_low_t *dqc_low) {
  tran_low_t abs_qc_low = abs_qc - 1;
  *qc_low = (-sign ^ abs_qc_low) + sign;
  assert((sign ? -abs_qc_low : abs_qc_low) == *qc_low);
  tran_low_t abs_dqc_low = (abs_qc_low * dqv) >> shift;
  *dqc_low = (-sign ^ abs_dqc_low) + sign;
  assert((sign ? -abs_dqc_low : abs_dqc_low) == *dqc_low);
}